

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

void __thiscall
CPP::WriteInitialization::acceptTabStops(WriteInitialization *this,DomTabStops *tabStops)

{
  FILE *__stream;
  QString *pQVar1;
  QTextStream *pQVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  QArrayData *local_d0;
  undefined8 *local_c8;
  QString local_b8;
  QArrayData *local_a0;
  undefined8 *local_98;
  QString local_88;
  QArrayDataPointer<QString> local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_70.d = (tabStops->m_tabStop).d.d;
  local_70.ptr = (tabStops->m_tabStop).d.ptr;
  local_70.size = (tabStops->m_tabStop).d.size;
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_70.size != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pQVar1 = local_70.ptr;
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      Driver::widgetVariableName
                (&local_88,this->m_driver,(QString *)((long)&((local_70.ptr)->d).d + lVar6));
      __stream = _stderr;
      if ((undefined1 *)local_88.d.size == (undefined1 *)0x0) {
        Option::messagePrefix(&local_b8,this->m_option);
        QString::toLocal8Bit_helper((QChar *)&local_a0,(longlong)local_b8.d.ptr);
        puVar4 = local_98;
        if (local_98 == (undefined8 *)0x0) {
          puVar4 = &QByteArray::_empty;
        }
        QString::toLocal8Bit_helper
                  ((QChar *)&local_d0,*(longlong *)((long)&(pQVar1->d).ptr + lVar6));
        puVar3 = local_c8;
        if (local_c8 == (undefined8 *)0x0) {
          puVar3 = &QByteArray::_empty;
        }
        fprintf(__stream,"%s: Warning: Tab-stop assignment: \'%s\' is not a valid widget.\n",puVar4,
                puVar3);
        if (local_d0 != (QArrayData *)0x0) {
          LOCK();
          (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_d0,1,0x10);
          }
        }
        if (local_a0 != (QArrayData *)0x0) {
          LOCK();
          (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a0,1,0x10);
          }
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        if (lVar6 != 0) {
          if (local_58.d.size == 0) goto LAB_00130788;
          pQVar2 = (QTextStream *)QTextStream::operator<<(this->m_output,&this->m_indent);
          pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"QWidget");
          pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(QString *)&language::qualifier);
          pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"setTabOrder(");
          pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,&local_58);
          pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,", ");
          pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,&local_88);
          pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,')');
          QTextStream::operator<<(pQVar2,(QString *)&language::eol);
        }
        QString::operator=(&local_58,&local_88);
      }
LAB_00130788:
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar5 < (ulong)local_70.size);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteInitialization::acceptTabStops(DomTabStops *tabStops)
{
    QString lastName;

    const QStringList l = tabStops->elementTabStop();
    for (int i=0; i<l.size(); ++i) {
        const QString name = m_driver->widgetVariableName(l.at(i));

        if (name.isEmpty()) {
            fprintf(stderr, "%s: Warning: Tab-stop assignment: '%s' is not a valid widget.\n",
                    qPrintable(m_option.messagePrefix()), qPrintable(l.at(i)));
            continue;
        }

        if (i == 0) {
            lastName = name;
            continue;
        }
        if (name.isEmpty() || lastName.isEmpty())
            continue;

        m_output << m_indent << "QWidget" << language::qualifier << "setTabOrder("
            << lastName << ", " << name << ')' << language::eol;

        lastName = name;
    }
}